

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreSieve.cpp
# Opt level: O3

void primesieve::PreSieve::preSieve
               (Vector<unsigned_char,_std::allocator<unsigned_char>_> *sieve,uint64_t segmentLow)

{
  uint8_t *preSieved0;
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  long lVar25;
  ulong uVar26;
  uchar *puVar27;
  ulong uVar28;
  uint8_t *preSieved3;
  uint8_t *preSieved2;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  uint8_t *preSieved1;
  ulong uVar33;
  ulong uVar34;
  uint8_t *sieveArray;
  uint8_t *sieve_00;
  uchar *__dest;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong bytes;
  ulong uVar43;
  bool bVar44;
  Array<unsigned_char,_8UL> primeBits;
  undefined8 local_38;
  
  bVar24 = (anonymous_namespace)::cpu_supports_avx512_bw;
  __dest = sieve->array_;
  puVar27 = sieve->end_;
  uVar35 = (long)puVar27 - (long)__dest;
  if (uVar35 != 0) {
    uVar39 = (segmentLow % 0x30f2a) / 0x1e;
    uVar33 = (segmentLow + ((segmentLow >> 1) / 0x17787) * -0x2ef0e) * 0x8888889 >> 0x20;
    uVar36 = (segmentLow + ((segmentLow >> 1) / 0x17ba1) * -0x2f742) * 0x8888889 >> 0x20;
    uVar34 = (segmentLow % 0x2ba16) / 0x1e;
    uVar31 = 0;
    do {
      uVar35 = uVar35 - uVar31;
      uVar29 = 0x1745 - uVar34;
      uVar28 = uVar35;
      if (uVar29 < uVar35) {
        uVar28 = uVar29;
      }
      uVar43 = 0x194f - uVar36;
      if (uVar43 < uVar28) {
        uVar28 = uVar43;
      }
      uVar42 = 0x1909 - uVar33;
      if (uVar42 < uVar28) {
        uVar28 = uVar42;
      }
      uVar37 = 0x1a1b - uVar39;
      if (uVar37 < uVar28) {
        uVar28 = uVar37;
      }
      if ((bVar24 & 1) == 0) {
        uVar26 = 0;
        if ((uVar28 & 0xfffffffffffffff0) != 0) {
          do {
            puVar1 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE_ + uVar34 + uVar26);
            uVar9 = puVar1[1];
            uVar10 = puVar1[2];
            uVar11 = puVar1[3];
            puVar2 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE0_ + uVar36 + uVar26);
            uVar12 = puVar2[1];
            uVar13 = puVar2[2];
            uVar14 = puVar2[3];
            puVar3 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE1_ + uVar33 + uVar26);
            uVar15 = puVar3[1];
            uVar16 = puVar3[2];
            uVar17 = puVar3[3];
            puVar4 = (uint *)(_ZGRN12_GLOBAL__N_114preSieveTablesE2_ + uVar39 + uVar26);
            uVar18 = puVar4[1];
            uVar19 = puVar4[2];
            uVar20 = puVar4[3];
            puVar5 = (uint *)(__dest + uVar31 + uVar26);
            *puVar5 = *puVar4 & *puVar3 & *puVar2 & *puVar1;
            puVar5[1] = uVar18 & uVar15 & uVar12 & uVar9;
            puVar5[2] = uVar19 & uVar16 & uVar13 & uVar10;
            puVar5[3] = uVar20 & uVar17 & uVar14 & uVar11;
            uVar26 = uVar26 + 0x10;
          } while (uVar26 < (uVar28 & 0xfffffffffffffff0));
        }
        if (uVar26 < uVar28) {
          if (uVar35 < uVar37) {
            uVar37 = uVar35;
          }
          if (uVar43 <= uVar37) {
            uVar37 = uVar43;
          }
          if (uVar42 <= uVar37) {
            uVar37 = uVar42;
          }
          if (uVar29 <= uVar37) {
            uVar37 = uVar29;
          }
          lVar32 = 0;
          do {
            __dest[lVar32 + uVar31 + uVar26] =
                 _ZGRN12_GLOBAL__N_114preSieveTablesE0_[lVar32 + uVar36 + uVar26] &
                 _ZGRN12_GLOBAL__N_114preSieveTablesE_[lVar32 + uVar26 + uVar34] &
                 _ZGRN12_GLOBAL__N_114preSieveTablesE1_[lVar32 + uVar33 + uVar26] &
                 _ZGRN12_GLOBAL__N_114preSieveTablesE2_[lVar32 + uVar39 + uVar26];
            lVar32 = lVar32 + 1;
          } while (uVar37 - uVar26 != lVar32);
        }
      }
      else {
        anon_unknown.dwarf_1a33a9::presieve1_x86_avx512
                  (_ZGRN12_GLOBAL__N_114preSieveTablesE_ + uVar34,
                   _ZGRN12_GLOBAL__N_114preSieveTablesE0_ + uVar36,
                   _ZGRN12_GLOBAL__N_114preSieveTablesE1_ + uVar33,
                   _ZGRN12_GLOBAL__N_114preSieveTablesE2_ + uVar39,__dest + uVar31,uVar28);
      }
      uVar31 = uVar31 + uVar28;
      bVar44 = 0x1744 < uVar34;
      uVar34 = uVar28 + uVar34;
      if (bVar44) {
        uVar34 = 0;
      }
      bVar44 = 0x194e < uVar36;
      uVar36 = uVar28 + uVar36;
      if (bVar44) {
        uVar36 = 0;
      }
      bVar44 = 0x1908 < uVar33;
      uVar33 = uVar28 + uVar33;
      if (bVar44) {
        uVar33 = 0;
      }
      bVar44 = 0x1a1a < uVar39;
      uVar39 = uVar28 + uVar39;
      if (bVar44) {
        uVar39 = 0;
      }
      __dest = sieve->array_;
      puVar27 = sieve->end_;
      uVar35 = (long)puVar27 - (long)__dest;
    } while (uVar31 < uVar35);
  }
  uVar35 = 4;
  do {
    uVar34 = (long)puVar27 - (long)__dest;
    if (uVar34 != 0) {
      lVar25 = uVar35 * 0x10;
      uVar36 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 8);
      uVar33 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 0x18);
      uVar39 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 0x28);
      uVar31 = *(ulong *)((anonymous_namespace)::preSieveTables + lVar25 + 0x38);
      uVar42 = (segmentLow % (uVar31 * 0x1e)) / 0x1e;
      lVar32 = *(long *)((anonymous_namespace)::preSieveTables + lVar25);
      lVar7 = *(long *)((anonymous_namespace)::preSieveTables + lVar25 + 0x10);
      lVar8 = *(long *)((anonymous_namespace)::preSieveTables + lVar25 + 0x20);
      lVar25 = *(long *)((anonymous_namespace)::preSieveTables + lVar25 + 0x30);
      uVar37 = 0;
      uVar28 = (segmentLow % (uVar33 * 0x1e)) / 0x1e;
      uVar29 = (segmentLow % (uVar39 * 0x1e)) / 0x1e;
      uVar43 = (segmentLow % (uVar36 * 0x1e)) / 0x1e;
      do {
        uVar34 = uVar34 - uVar37;
        uVar26 = uVar36 - uVar43;
        bytes = uVar34;
        if (uVar26 < uVar34) {
          bytes = uVar26;
        }
        uVar38 = uVar33 - uVar28;
        if (uVar38 < bytes) {
          bytes = uVar38;
        }
        uVar40 = uVar39 - uVar29;
        if (uVar40 < bytes) {
          bytes = uVar40;
        }
        uVar30 = uVar31 - uVar42;
        if (uVar30 < bytes) {
          bytes = uVar30;
        }
        preSieved0 = (uint8_t *)(lVar32 + uVar43);
        preSieved1 = (uint8_t *)(lVar7 + uVar28);
        preSieved2 = (uint8_t *)(uVar29 + lVar8);
        preSieved3 = (uint8_t *)(uVar42 + lVar25);
        sieve_00 = __dest + uVar37;
        if ((bVar24 & 1) == 0) {
          uVar41 = 0;
          if ((bytes & 0xfffffffffffffff0) != 0) {
            do {
              puVar1 = (uint *)(sieve_00 + uVar41);
              uVar9 = puVar1[1];
              uVar10 = puVar1[2];
              uVar11 = puVar1[3];
              puVar2 = (uint *)(preSieved0 + uVar41);
              uVar12 = puVar2[1];
              uVar13 = puVar2[2];
              uVar14 = puVar2[3];
              puVar3 = (uint *)(preSieved1 + uVar41);
              uVar15 = puVar3[1];
              uVar16 = puVar3[2];
              uVar17 = puVar3[3];
              puVar4 = (uint *)(preSieved2 + uVar41);
              uVar18 = puVar4[1];
              uVar19 = puVar4[2];
              uVar20 = puVar4[3];
              puVar5 = (uint *)(preSieved3 + uVar41);
              uVar21 = puVar5[1];
              uVar22 = puVar5[2];
              uVar23 = puVar5[3];
              puVar6 = (uint *)(sieve_00 + uVar41);
              *puVar6 = *puVar5 & *puVar4 & *puVar3 & *puVar2 & *puVar1;
              puVar6[1] = uVar21 & uVar18 & uVar15 & uVar12 & uVar9;
              puVar6[2] = uVar22 & uVar19 & uVar16 & uVar13 & uVar10;
              puVar6[3] = uVar23 & uVar20 & uVar17 & uVar14 & uVar11;
              uVar41 = uVar41 + 0x10;
            } while (uVar41 < (bytes & 0xfffffffffffffff0));
          }
          if (uVar41 < bytes) {
            if (uVar34 < uVar26) {
              uVar26 = uVar34;
            }
            if (uVar38 <= uVar26) {
              uVar26 = uVar38;
            }
            if (uVar40 <= uVar26) {
              uVar26 = uVar40;
            }
            if (uVar30 <= uVar26) {
              uVar26 = uVar30;
            }
            do {
              sieve_00[uVar41] =
                   sieve_00[uVar41] &
                   preSieved1[uVar41] & preSieved0[uVar41] & preSieved2[uVar41] & preSieved3[uVar41]
              ;
              uVar41 = uVar41 + 1;
            } while (uVar26 != uVar41);
          }
        }
        else {
          anon_unknown.dwarf_1a33a9::presieve2_x86_avx512
                    (preSieved0,preSieved1,preSieved2,preSieved3,sieve_00,bytes);
        }
        uVar37 = uVar37 + bytes;
        uVar26 = bytes + uVar43;
        if (uVar36 <= uVar43) {
          uVar26 = 0;
        }
        uVar43 = bytes + uVar28;
        if (uVar33 <= uVar28) {
          uVar43 = 0;
        }
        uVar38 = bytes + uVar29;
        if (uVar39 <= uVar29) {
          uVar38 = 0;
        }
        bVar44 = uVar31 <= uVar42;
        uVar42 = bytes + uVar42;
        if (bVar44) {
          uVar42 = 0;
        }
        __dest = sieve->array_;
        puVar27 = sieve->end_;
        uVar34 = (long)puVar27 - (long)__dest;
        uVar28 = uVar43;
        uVar29 = uVar38;
        uVar43 = uVar26;
      } while (uVar37 < uVar34);
    }
    bVar44 = uVar35 < 0xc;
    uVar35 = uVar35 + 4;
  } while (bVar44);
  if (segmentLow < 0xa4) {
    local_38 = 0xfc9eeddb3f77efff;
    uVar35 = (ulong)(((uint)segmentLow & 0xff) / 0x1e);
    memcpy(__dest,(void *)((long)&local_38 + uVar35),8 - uVar35);
  }
  return;
}

Assistant:

void PreSieve::preSieve(Vector<uint8_t>& sieve, uint64_t segmentLow)
{
  uint64_t offset = 0;
  uint64_t pos0, pos1, pos2, pos3;

  pos0 = (segmentLow % (preSieveTables[0].size() * 30)) / 30;
  pos1 = (segmentLow % (preSieveTables[1].size() * 30)) / 30;
  pos2 = (segmentLow % (preSieveTables[2].size() * 30)) / 30;
  pos3 = (segmentLow % (preSieveTables[3].size() * 30)) / 30;

  // PreSieve algo 1
  while (offset < sieve.size())
  {
    uint64_t bytesToCopy = sieve.size() - offset;

    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[0].size() - pos0));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[1].size() - pos1));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[2].size() - pos2));
    bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[3].size() - pos3));

    presieve1(&*(preSieveTables[0].begin() + pos0),
              &*(preSieveTables[1].begin() + pos1),
              &*(preSieveTables[2].begin() + pos2),
              &*(preSieveTables[3].begin() + pos3),
              &sieve[offset],
              bytesToCopy);

    offset += bytesToCopy;

    pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[0].size());
    pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[1].size());
    pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[2].size());
    pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[3].size());
  }

  // PreSieve algo 2
  for (std::size_t i = 4; i < preSieveTables.size(); i += 4)
  {
    offset = 0;

    pos0 = (segmentLow % (preSieveTables[i+0].size() * 30)) / 30;
    pos1 = (segmentLow % (preSieveTables[i+1].size() * 30)) / 30;
    pos2 = (segmentLow % (preSieveTables[i+2].size() * 30)) / 30;
    pos3 = (segmentLow % (preSieveTables[i+3].size() * 30)) / 30;

    while (offset < sieve.size())
    {
      uint64_t bytesToCopy = sieve.size() - offset;

      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+0].size() - pos0));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+1].size() - pos1));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+2].size() - pos2));
      bytesToCopy = std::min(bytesToCopy, uint64_t(preSieveTables[i+3].size() - pos3));

      presieve2(&*(preSieveTables[i+0].begin() + pos0),
                &*(preSieveTables[i+1].begin() + pos1),
                &*(preSieveTables[i+2].begin() + pos2),
                &*(preSieveTables[i+3].begin() + pos3),
                &sieve[offset],
                bytesToCopy);

      offset += bytesToCopy;

      pos0 = (pos0 + bytesToCopy) * (pos0 < preSieveTables[i+0].size());
      pos1 = (pos1 + bytesToCopy) * (pos1 < preSieveTables[i+1].size());
      pos2 = (pos2 + bytesToCopy) * (pos2 < preSieveTables[i+2].size());
      pos3 = (pos3 + bytesToCopy) * (pos3 < preSieveTables[i+3].size());
    }
  }

  // Pre-sieving removes the primes <= 163. We
  // have to undo that work and reset these bits
  // to 1 (but 49 = 7 * 7 is not a prime).
  if (segmentLow <= getMaxPrime())
  {
    uint64_t i = segmentLow / 30;
    uint8_t* sieveArray = sieve.data();
    Array<uint8_t, 8> primeBits = { 0xff, 0xef, 0x77, 0x3f, 0xdb, 0xed, 0x9e, 0xfc };

    ASSERT(sieve.capacity() >= primeBits.size());
    for (std::size_t j = 0; i + j < primeBits.size(); j++)
      sieveArray[j] = primeBits[i + j];
  }
}